

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhCursorDelete(unqlite_kv_cursor *pCursor)

{
  lhcell *pCell;
  lhash_kv_engine *pEngine;
  unqlite_page *pPage;
  int iVar1;
  lhash_kv_cursor *pCur;
  unqlite_page *pOvfl;
  pgno iNext;
  
  iVar1 = -9;
  if (*(int *)&pCursor[1].pStore == 2) {
    pCell = (lhcell *)pCursor[2].pStore;
    if (pCell != (lhcell *)0x0) {
      pCursor[2].pStore = (unqlite_kv_engine *)pCell->pNext;
      if (pCell->iOvfl != 0) {
        pEngine = pCell->pPage->pHash;
        iNext = pCell->iOvfl;
        do {
          iVar1 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,iNext,&pOvfl);
          pPage = pOvfl;
          if (iVar1 != 0) {
            return iVar1;
          }
          SyBigEndianUnpack64(pOvfl->zData,&iNext);
          iVar1 = lhRestorePage(pEngine,pPage);
          if (iVar1 != 0) {
            return iVar1;
          }
          (*pEngine->pIo->xPageUnref)(pOvfl);
        } while (iNext != 0);
      }
      iVar1 = lhUnlinkCell(pCell);
    }
  }
  return iVar1;
}

Assistant:

static int lhCursorDelete(unqlite_kv_cursor *pCursor)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell  */
	pCell = pCur->pCell;
	/* Point to the next entry */
	pCur->pCell = pCell->pNext;
	/* Perform the deletion */
	rc = lhRecordRemove(pCell);
	return rc;
}